

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

string * __thiscall
helics::CommonCore::federateQuery_abi_cxx11_
          (string *__return_storage_ptr__,CommonCore *this,FederateState *fed,string_view queryStr,
          bool force_ordering)

{
  value_t vVar1;
  json_value jVar2;
  bool bVar3;
  FederateStates state;
  string *psVar4;
  reference pvVar5;
  char *__s;
  undefined7 in_register_00000089;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  string_view request;
  string_view fmt;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  format_args args;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *in_stack_ffffffffffffff28;
  allocator<char> local_c9;
  string resultString;
  json json;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  data local_60;
  string local_50;
  
  aVar6._1_7_ = in_register_00000089;
  aVar6._0_1_ = force_ordering;
  __y._M_str = "exists";
  __y._M_len = 6;
  bVar3 = std::operator==(queryStr,__y);
  if (fed == (FederateState *)0x0) {
    if (bVar3) {
      __s = "false";
      goto LAB_00290867;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resultString,"Federate not found",(allocator<char> *)&json);
    generateJsonErrorResponse(__return_storage_ptr__,NOT_FOUND,&resultString);
  }
  else {
    if (bVar3) {
      __s = "true";
LAB_00290867:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,(allocator<char> *)&resultString);
      return __return_storage_ptr__;
    }
    __y_00._M_str = "version";
    __y_00._M_len = 7;
    bVar3 = std::operator==(queryStr,__y_00);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&json,"\"",(allocator<char> *)&local_80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &resultString,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&json,
                     "3.6.1 (2025-02-24)");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &resultString,'\"');
      std::__cxx11::string::~string((string *)&resultString);
      psVar4 = (string *)&json;
      goto LAB_0029082c;
    }
    __y_01._M_str = "isinit";
    __y_01._M_len = 6;
    bVar3 = std::operator==(queryStr,__y_01);
    if (bVar3) {
      __s = "false";
      if (((fed->init_transmitted)._M_base._M_i & 1U) != 0) {
        __s = "true";
      }
      goto LAB_00290867;
    }
    __y_02._M_str = "state";
    __y_02._M_len = 5;
    bVar3 = std::operator==(queryStr,__y_02);
    if (bVar3 && !force_ordering) {
      state = FederateState::getState(fed);
      psVar4 = fedStateString_abi_cxx11_(state);
      resultString._M_dataplus._M_p = (psVar4->_M_dataplus)._M_p;
      resultString._M_string_length = psVar4->_M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x4;
      args.field_1.args_ = aVar6.args_;
      args.desc_ = (unsigned_long_long)&resultString;
      ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)0x3a741f,fmt,args);
      return __return_storage_ptr__;
    }
    __y_03._M_str = "filtered_endpoints";
    __y_03._M_len = 0x12;
    bVar3 = std::operator==(queryStr,__y_03);
    if (bVar3 && !force_ordering) {
      filteredEndpointQuery_abi_cxx11_(__return_storage_ptr__,this,fed);
      return __return_storage_ptr__;
    }
    json.m_data.m_type = null;
    json.m_data._1_7_ = 0;
    json.m_data.m_value.object = (object_t *)0x0;
    request._M_str = (char *)&this->loopHandles;
    request._M_len = (size_t)queryStr._M_str;
    generateInterfaceQueryResults
              (&resultString,(helics *)queryStr._M_len,request,
               (HandleManager *)(ulong)(uint)(fed->global_id)._M_i.gid,
               (GlobalFederateId)(BaseType)&json,in_stack_ffffffffffffff28);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&json);
    if (resultString._M_string_length == 0) {
      __y_04._M_str = "interfaces";
      __y_04._M_len = 10;
      bVar3 = std::operator==(queryStr,__y_04);
      if (bVar3) {
        local_80._M_dataplus._M_p._0_4_ = (fed->global_id)._M_i.gid;
        generateInterfaceConfig_abi_cxx11_
                  ((helics *)&json,&this->loopHandles,(GlobalFederateId *)&local_80);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fed);
        pvVar5 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&json,"name");
        vVar1 = (pvVar5->m_data).m_type;
        (pvVar5->m_data).m_type = local_60.m_type;
        jVar2 = (pvVar5->m_data).m_value;
        (pvVar5->m_data).m_value = local_60.m_value;
        local_60.m_type = vVar1;
        local_60.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_60);
        fileops::generateJsonString(__return_storage_ptr__,&json,true);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&json.m_data);
      }
      else {
        __y_05._M_str = "queries";
        __y_05._M_len = 7;
        bVar3 = std::operator==(queryStr,__y_05);
        if ((bVar3) ||
           (__y_06._M_str = "available_queries", __y_06._M_len = 0x11,
           bVar3 = std::operator==(queryStr,__y_06), bVar3)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,
                     "[\"exists\",\"isinit\",\"global_state\",\"version\",\"state\",\"queries\",\"interfaces\",\"filtered_endpoints\","
                     ,&local_c9);
          FederateState::processQuery_abi_cxx11_(&local_50,fed,queryStr,false);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&json,
                         &local_80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&json,
                         "]");
          std::__cxx11::string::~string((string *)&json);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_80);
        }
        else {
          FederateState::processQuery_abi_cxx11_(__return_storage_ptr__,fed,queryStr,force_ordering)
          ;
        }
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)resultString._M_dataplus._M_p == &resultString.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(resultString.field_2._M_allocated_capacity._1_7_,
                      resultString.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = resultString.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = resultString._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(resultString.field_2._M_allocated_capacity._1_7_,
                      resultString.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = resultString._M_string_length;
      resultString._M_string_length = 0;
      resultString.field_2._M_local_buf[0] = '\0';
      resultString._M_dataplus._M_p = (pointer)&resultString.field_2;
    }
  }
  psVar4 = &resultString;
LAB_0029082c:
  std::__cxx11::string::~string((string *)psVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string CommonCore::federateQuery(const FederateState* fed,
                                      std::string_view queryStr,
                                      bool force_ordering) const
{
    if (fed == nullptr) {
        if (queryStr == "exists") {
            return "false";
        }
        return generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND, "Federate not found");
    }
    if (queryStr == "exists") {
        return "true";
    }
    if (queryStr == "version") {
        return std::string{"\""} + versionString + '"';
    }
    if (queryStr == "isinit") {
        return (fed->init_transmitted.load()) ? "true" : "false";
    }
    if (queryStr == "state") {
        if (!force_ordering) {
            return fmt::format("\"{}\"", fedStateString(fed->getState()));
        }
    }
    if (queryStr == "filtered_endpoints") {
        if (!force_ordering) {
            return filteredEndpointQuery(fed);
        }
    }
    auto resultString = generateInterfaceQueryResults(queryStr,
                                                      loopHandles,
                                                      fed->global_id,
                                                      [](nlohmann::json& /*unused*/) {});
    if (!resultString.empty()) {
        return resultString;
    }
    if (queryStr == "interfaces") {
        auto json = generateInterfaceConfig(loopHandles, fed->global_id);
        json["name"] = fed->getIdentifier();
        return fileops::generateJsonString(json);
    }
    if ((queryStr == "queries") || (queryStr == "available_queries")) {
        return std::string(
                   R"(["exists","isinit","global_state","version","state","queries","interfaces","filtered_endpoints",)") +
            fed->processQuery(queryStr) + "]";
    }
    return fed->processQuery(queryStr, force_ordering);
}